

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.h
# Opt level: O3

void __thiscall
fmt::v7::detail::ansi_color_escape<char>::ansi_color_escape
          (ansi_color_escape<char> *this,color_type text_color,char *esc)

{
  color_union cVar1;
  char cVar2;
  byte bVar3;
  int i;
  long lVar4;
  char *pcVar5;
  uint uVar6;
  uint uVar7;
  
  cVar1 = text_color.value;
  if (((ulong)text_color & 1) == 0) {
    this->buffer[0] = '\x1b';
    this->buffer[1] = '[';
    lVar4 = 2;
    uVar6 = (cVar1.rgb_color & 0xff) + 10;
    if (esc != "\x1b[48;2;") {
      uVar6 = cVar1.rgb_color & 0xff;
    }
    if (99 < uVar6) {
      this->buffer[2] = '1';
      uVar6 = uVar6 % 100;
      lVar4 = 3;
    }
    pcVar5 = this->buffer + lVar4 + 3;
    bVar3 = (byte)((uVar6 & 0xff) / 10);
    pcVar5[-3] = bVar3 | 0x30;
    pcVar5[-2] = (char)uVar6 + bVar3 * -10 | 0x30;
    pcVar5[-1] = 'm';
  }
  else {
    lVar4 = 0;
    do {
      this->buffer[lVar4] = esc[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 7);
    uVar6 = text_color.value._2_2_ & 0xff;
    uVar7 = uVar6 / 10;
    this->buffer[7] = (byte)(uVar6 * 0x29 >> 0xc) | 0x30;
    cVar2 = (char)uVar7;
    uVar6 = cVar1.rgb_color >> 8 & 0xff;
    this->buffer[8] = cVar2 + (char)(uVar7 * 0x1a >> 8) * -10 | 0x30;
    this->buffer[9] = text_color.value._2_1_ + cVar2 * -10 | 0x30;
    this->buffer[10] = ';';
    uVar7 = uVar6 / 10;
    this->buffer[0xb] = (byte)(uVar6 * 0x29 >> 0xc) | 0x30;
    cVar2 = (char)uVar7;
    this->buffer[0xc] = cVar2 + (char)(uVar7 * 0x1a >> 8) * -10 | 0x30;
    this->buffer[0xd] = text_color.value._1_1_ + cVar2 * -10 | 0x30;
    this->buffer[0xe] = ';';
    uVar6 = (cVar1.rgb_color & 0xff) / 10;
    this->buffer[0xf] = (byte)((cVar1.rgb_color & 0xff) * 0x29 >> 0xc) | 0x30;
    cVar2 = (char)uVar6;
    this->buffer[0x10] = cVar2 + (char)(uVar6 * 0x1a >> 8) * -10 | 0x30;
    this->buffer[0x11] = text_color.value._0_1_ + cVar2 * -10 | 0x30;
    this->buffer[0x12] = 'm';
    pcVar5 = this->buffer + 0x13;
  }
  *pcVar5 = '\0';
  return;
}

Assistant:

FMT_CONSTEXPR ansi_color_escape(detail::color_type text_color,
                                  const char* esc) FMT_NOEXCEPT {
    // If we have a terminal color, we need to output another escape code
    // sequence.
    if (!text_color.is_rgb) {
      bool is_background = esc == detail::data::background_color;
      uint32_t value = text_color.value.term_color;
      // Background ASCII codes are the same as the foreground ones but with
      // 10 more.
      if (is_background) value += 10u;

      size_t index = 0;
      buffer[index++] = static_cast<Char>('\x1b');
      buffer[index++] = static_cast<Char>('[');

      if (value >= 100u) {
        buffer[index++] = static_cast<Char>('1');
        value %= 100u;
      }
      buffer[index++] = static_cast<Char>('0' + value / 10u);
      buffer[index++] = static_cast<Char>('0' + value % 10u);

      buffer[index++] = static_cast<Char>('m');
      buffer[index++] = static_cast<Char>('\0');
      return;
    }

    for (int i = 0; i < 7; i++) {
      buffer[i] = static_cast<Char>(esc[i]);
    }
    rgb color(text_color.value.rgb_color);
    to_esc(color.r, buffer + 7, ';');
    to_esc(color.g, buffer + 11, ';');
    to_esc(color.b, buffer + 15, 'm');
    buffer[19] = static_cast<Char>(0);
  }